

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

size_t zt_binary_to_hex(void *data,size_t dlen,char *hex,size_t hlen)

{
  ulong uVar1;
  byte bVar2;
  char *dptr;
  char *pcVar3;
  ulong uVar4;
  
  if (hlen != 0 && dlen != 0) {
    pcVar3 = hex;
    uVar4 = 0;
    do {
      if (hex != (char *)0x0) {
        bVar2 = *(byte *)((long)data + uVar4);
        *pcVar3 = "0123456789abcdef"[bVar2 >> 4];
        pcVar3[1] = "0123456789abcdef"[bVar2 & 0xf];
      }
      uVar1 = uVar4 * 2 + 2;
    } while ((uVar4 + 1 < dlen) && (pcVar3 = pcVar3 + 2, uVar4 = uVar4 + 1, uVar1 < hlen));
    return uVar1;
  }
  return 0;
}

Assistant:

size_t
zt_binary_to_hex(void *data, size_t dlen, char *hex, size_t hlen) {
    size_t n;
    char * dptr = hex;

    for (n = 0; (n < dlen) && ((n * 2) < hlen); n++, dptr += 2) {
        uint8_t c = ((uint8_t *)data)[n];
        if (hex != NULL) {
            dptr[0] = HEX_DIGITS[((c >> 4) & 0xF)];
            dptr[1] = HEX_DIGITS[(c & 0xF)];
        }
    }
    return n * 2;
}